

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * simd_test_sse2::c_imm_v256_shr_n_s64<32>(c_v256 a)

{
  c_v128 cVar1;
  c_v128 cVar2;
  c_v256 *in_RDI;
  
  cVar1.u32[2] = a.u32[5];
  cVar1.u64[0] = (long)a.s32[5];
  cVar1.s32[3] = a.s32[5] >> 0x1f;
  in_RDI->v128[1] = cVar1;
  cVar2.u32[2] = a.u32[1];
  cVar2.u64[0] = (long)a.s32[1];
  cVar2.s32[3] = a.s32[1] >> 0x1f;
  in_RDI->v128[0] = cVar2;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shr_s64(c_v256 a, unsigned int n) {
  c_v256 t;
  if (SIMD_CHECK && n > 63) {
    fprintf(stderr, "Error: undefined s64 shift right %d\n", n);
    abort();
  }
  t.s64[3] = a.s64[3] >> n;
  t.s64[2] = a.s64[2] >> n;
  t.s64[1] = a.s64[1] >> n;
  t.s64[0] = a.s64[0] >> n;
  return t;
}